

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int DecodeImageData(VP8LDecoder *dec,uint32_t *data,int width,int height,int last_row,
                   ProcessRowsFunc process_func)

{
  VP8LBitReader *br;
  VP8LColorCache *src;
  uint32_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  ulong uVar8;
  vp8l_val_t vVar9;
  uint8_t *puVar10;
  size_t sVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint32_t *puVar19;
  ulong uVar20;
  HuffmanCode *pHVar21;
  uint32_t *puVar22;
  uint32_t *puVar23;
  int iVar24;
  uint uVar25;
  uint32_t uVar26;
  ulong uVar27;
  VP8LColorCache *pVVar28;
  bool bVar29;
  HTreeGroup *local_80;
  int local_6c;
  
  iVar16 = dec->last_pixel_;
  uVar20 = (long)iVar16 / (long)width;
  uVar8 = (long)iVar16 % (long)width;
  uVar27 = uVar20 & 0xffffffff;
  iVar24 = (int)uVar20;
  uVar20 = uVar8 & 0xffffffff;
  br = &dec->br_;
  iVar4 = (dec->hdr_).color_cache_size_;
  local_6c = 0x1000000;
  if (dec->incremental_ != 0) {
    local_6c = iVar24;
  }
  src = &(dec->hdr_).color_cache_;
  pVVar28 = (VP8LColorCache *)0x0;
  if (0 < iVar4) {
    pVVar28 = src;
  }
  puVar19 = data + iVar16;
  puVar1 = data + last_row * width;
  if (iVar16 < last_row * width) {
    iVar16 = (dec->hdr_).huffman_subsample_bits_;
    if (iVar16 == 0) {
      lVar18 = 0;
    }
    else {
      bVar15 = (byte)iVar16;
      lVar18 = (long)(int)(dec->hdr_).huffman_image_
                          [((int)uVar8 >> (bVar15 & 0x1f)) +
                           (iVar24 >> (bVar15 & 0x1f)) * (dec->hdr_).huffman_xsize_];
    }
    uVar14 = (dec->hdr_).huffman_mask_;
    local_80 = (dec->hdr_).htree_groups_ + lVar18;
    puVar23 = puVar19;
    do {
      iVar24 = (int)uVar27;
      if (local_6c <= iVar24) {
        iVar16 = (dec->br_).eos_;
        (dec->saved_br_).bit_pos_ = (dec->br_).bit_pos_;
        (dec->saved_br_).eos_ = iVar16;
        vVar9 = br->val_;
        puVar10 = (dec->br_).buf_;
        sVar11 = (dec->br_).pos_;
        (dec->saved_br_).len_ = (dec->br_).len_;
        (dec->saved_br_).pos_ = sVar11;
        (dec->saved_br_).val_ = vVar9;
        (dec->saved_br_).buf_ = puVar10;
        dec->saved_last_pixel_ = (int)((ulong)((long)puVar19 - (long)data) >> 2);
        if (0 < (dec->hdr_).color_cache_size_) {
          VP8LColorCacheCopy(src,&(dec->hdr_).saved_color_cache_);
        }
        local_6c = iVar24 + 8;
      }
      uVar25 = (uint)uVar20;
      if ((uVar14 & uVar25) == 0) {
        iVar16 = (dec->hdr_).huffman_subsample_bits_;
        if (iVar16 == 0) {
          lVar18 = 0;
        }
        else {
          bVar15 = (byte)iVar16;
          lVar18 = (long)(int)(dec->hdr_).huffman_image_
                              [((int)uVar25 >> (bVar15 & 0x1f)) +
                               (iVar24 >> (bVar15 & 0x1f)) * (dec->hdr_).huffman_xsize_];
        }
        local_80 = (dec->hdr_).htree_groups_ + lVar18;
      }
      if (local_80->is_trivial_code != 0) {
        uVar26 = local_80->literal_arb;
        goto LAB_0010a772;
      }
      if (0x1f < (dec->br_).bit_pos_) {
        VP8LDoFillBitWindow(br);
      }
      if (local_80->use_packed_table == 0) {
        uVar20 = (dec->br_).val_;
        iVar16 = (dec->br_).bit_pos_;
        pHVar21 = local_80->htrees[0] + (uVar20 >> ((byte)iVar16 & 0x3f) & 0xff);
        bVar15 = pHVar21->bits;
        if (8 < bVar15) {
          iVar16 = iVar16 + 8;
          pHVar21 = pHVar21 + (ulong)pHVar21->value +
                              (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                     (uint)(uVar20 >> ((byte)iVar16 & 0x3f)));
          bVar15 = pHVar21->bits;
        }
        (dec->br_).bit_pos_ = (uint)bVar15 + iVar16;
        if ((dec->br_).eos_ != 0) break;
        uVar26 = (uint32_t)pHVar21->value;
LAB_0010a907:
        if (((dec->br_).pos_ == (dec->br_).len_) && (0x40 < (dec->br_).bit_pos_)) break;
        if ((int)uVar26 < 0x100) {
          if (local_80->is_trivial_literal == 0) {
            iVar16 = (dec->br_).bit_pos_;
            pHVar21 = local_80->htrees[1] + (uVar20 >> ((byte)iVar16 & 0x3f) & 0xff);
            bVar15 = pHVar21->bits;
            if (8 < bVar15) {
              iVar16 = iVar16 + 8;
              pHVar21 = pHVar21 + (ulong)pHVar21->value +
                                  (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                         (uint)(uVar20 >> ((byte)iVar16 & 0x3f)));
              bVar15 = pHVar21->bits;
            }
            iVar16 = (uint)bVar15 + iVar16;
            (dec->br_).bit_pos_ = iVar16;
            uVar2 = pHVar21->value;
            if (0x1f < iVar16) {
              VP8LDoFillBitWindow(br);
              uVar20 = (dec->br_).val_;
              iVar16 = (dec->br_).bit_pos_;
            }
            pHVar21 = local_80->htrees[2] + (uVar20 >> ((byte)iVar16 & 0x3f) & 0xff);
            bVar15 = pHVar21->bits;
            if (8 < bVar15) {
              iVar16 = iVar16 + 8;
              pHVar21 = pHVar21 + (ulong)pHVar21->value +
                                  (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                         (uint)(uVar20 >> ((byte)iVar16 & 0x3f)));
              bVar15 = pHVar21->bits;
            }
            iVar16 = (uint)bVar15 + iVar16;
            uVar3 = pHVar21->value;
            pHVar21 = local_80->htrees[3] + (uVar20 >> ((byte)iVar16 & 0x3f) & 0xff);
            bVar15 = pHVar21->bits;
            if (8 < bVar15) {
              iVar16 = iVar16 + 8;
              pHVar21 = pHVar21 + (ulong)pHVar21->value +
                                  (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                         (uint)(uVar20 >> ((byte)iVar16 & 0x3f)));
              bVar15 = pHVar21->bits;
            }
            (dec->br_).bit_pos_ = (uint)bVar15 + iVar16;
            if (((dec->br_).eos_ != 0) ||
               (((dec->br_).pos_ == (dec->br_).len_ && (0x40 < (int)((uint)bVar15 + iVar16)))))
            break;
            uVar26 = uVar26 << 8 | (uint)uVar2 << 0x10 | (uint)uVar3 | (uint)pHVar21->value << 0x18;
          }
          else {
            uVar26 = uVar26 << 8 | local_80->literal_arb;
          }
LAB_0010a772:
          *puVar19 = uVar26;
          goto LAB_0010a775;
        }
        if (0x117 < uVar26) {
          if ((int)uVar26 < iVar4 + 0x118) {
            puVar7 = src->colors_;
            for (; puVar23 < puVar19; puVar23 = puVar23 + 1) {
              puVar7[(int)(*puVar23 * 0x1e35a7bd >> ((byte)pVVar28->hash_shift_ & 0x1f))] = *puVar23
              ;
            }
            uVar26 = puVar7[(ulong)uVar26 - 0x118];
            goto LAB_0010a772;
          }
          goto LAB_0010ae54;
        }
        uVar12 = uVar26 - 0x100;
        if (3 < uVar12) {
          uVar12 = uVar26 - 0x102 >> 1;
          uVar13 = VP8LReadBits(br,uVar12);
          uVar12 = uVar13 + ((uVar26 & 1 | 2) << ((byte)uVar12 & 0x1f));
          uVar20 = br->val_;
        }
        iVar16 = (dec->br_).bit_pos_;
        pHVar21 = local_80->htrees[4] + (uVar20 >> ((byte)iVar16 & 0x3f) & 0xff);
        bVar15 = pHVar21->bits;
        if (8 < bVar15) {
          iVar16 = iVar16 + 8;
          pHVar21 = pHVar21 + (ulong)pHVar21->value +
                              (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                     (uint)(uVar20 >> ((byte)iVar16 & 0x3f)));
          bVar15 = pHVar21->bits;
        }
        (dec->br_).bit_pos_ = (uint)bVar15 + iVar16;
        uVar2 = pHVar21->value;
        uVar17 = (uint)uVar2;
        if (0x1f < (int)((uint)bVar15 + iVar16)) {
          VP8LDoFillBitWindow(br);
        }
        if (3 < uVar2) {
          uVar17 = uVar2 - 2 >> 1;
          uVar26 = VP8LReadBits(br,uVar17);
          uVar17 = uVar26 + ((uVar2 & 1 | 2) << ((byte)uVar17 & 0x1f));
        }
        if ((int)(uVar17 + 1) < 0x79) {
          uVar17 = ((uint)("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                           [(int)uVar17] >> 4) * width -
                   ("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                    [(int)uVar17] & 0xf)) + 8;
          if ((int)uVar17 < 2) {
            uVar17 = 1;
          }
        }
        else {
          uVar17 = uVar17 - 0x77;
        }
        if (((dec->br_).eos_ != 0) ||
           (((dec->br_).pos_ == (dec->br_).len_ && (0x40 < (dec->br_).bit_pos_)))) break;
        if ((long)puVar19 - (long)data >> 2 < (long)(ulong)uVar17) goto LAB_0010ae54;
        iVar16 = uVar12 + 1;
        if ((long)data + ((long)(height * width) * 4 - (long)puVar19) >> 2 < (long)iVar16)
        goto LAB_0010ae54;
        CopyBlock32b(puVar19,uVar17,iVar16);
        uVar25 = uVar25 + iVar16;
        while( true ) {
          uVar20 = (ulong)uVar25;
          iVar24 = (int)uVar27;
          if ((int)uVar25 < width) break;
          uVar12 = iVar24 + 1;
          uVar27 = (ulong)uVar12;
          if ((uVar12 & 0xf) == 0 && (iVar24 < last_row && process_func != (ProcessRowsFunc)0x0)) {
            (*process_func)(dec,uVar12);
          }
          uVar25 = uVar25 - width;
        }
        if ((uVar14 & uVar25) != 0) {
          iVar5 = (dec->hdr_).huffman_subsample_bits_;
          if (iVar5 == 0) {
            lVar18 = 0;
          }
          else {
            bVar15 = (byte)iVar5;
            lVar18 = (long)(int)(dec->hdr_).huffman_image_
                                [((int)uVar25 >> (bVar15 & 0x1f)) +
                                 (iVar24 >> (bVar15 & 0x1f)) * (dec->hdr_).huffman_xsize_];
          }
          local_80 = (dec->hdr_).htree_groups_ + lVar18;
        }
        puVar7 = puVar19 + iVar16;
        if ((0 < iVar4) && (puVar23 < puVar7)) {
          puVar19 = src->colors_;
          do {
            uVar26 = *puVar23;
            puVar23 = puVar23 + 1;
            puVar19[(int)(uVar26 * 0x1e35a7bd >> ((byte)pVVar28->hash_shift_ & 0x1f))] = uVar26;
          } while (puVar23 < puVar7);
        }
      }
      else {
        uVar20 = (dec->br_).val_;
        iVar16 = (dec->br_).bit_pos_;
        uVar12 = (uint)(uVar20 >> ((byte)iVar16 & 0x3f)) & 0x3f;
        iVar5 = local_80->packed_table[uVar12].bits;
        uVar26 = local_80->packed_table[uVar12].value;
        iVar16 = iVar16 + iVar5;
        if (iVar5 < 0x100) {
          (dec->br_).bit_pos_ = iVar16;
          *puVar19 = uVar26;
          uVar26 = 0;
        }
        else {
          (dec->br_).bit_pos_ = iVar16 + -0x100;
        }
        if (((dec->br_).eos_ != 0) ||
           (((dec->br_).pos_ == (dec->br_).len_ && (0x40 < (dec->br_).bit_pos_)))) break;
        if (uVar26 != 0) goto LAB_0010a907;
LAB_0010a775:
        puVar7 = puVar19 + 1;
        uVar20 = (ulong)(uVar25 + 1);
        if (width <= (int)(uVar25 + 1)) {
          uVar25 = iVar24 + 1;
          uVar27 = (ulong)uVar25;
          if ((uVar25 & 0xf) == 0 && (iVar24 < last_row && process_func != (ProcessRowsFunc)0x0)) {
            (*process_func)(dec,uVar25);
          }
          uVar20 = 0;
          if ((0 < iVar4) && (puVar23 < puVar7)) {
            puVar6 = src->colors_;
            puVar22 = puVar23;
            do {
              puVar23 = puVar22 + 1;
              puVar6[(int)(*puVar22 * 0x1e35a7bd >> ((byte)pVVar28->hash_shift_ & 0x1f))] = *puVar22
              ;
              bVar29 = puVar22 < puVar19;
              puVar22 = puVar23;
            } while (bVar29);
          }
        }
      }
      puVar19 = puVar7;
      iVar24 = (int)uVar27;
    } while (puVar19 < puVar1);
  }
  uVar14 = 1;
  if (((dec->br_).eos_ == 0) && (uVar14 = 0, (dec->br_).pos_ == (dec->br_).len_)) {
    uVar14 = (uint)(0x40 < (dec->br_).bit_pos_);
  }
  (dec->br_).eos_ = uVar14;
  if (((dec->incremental_ == 0) || (uVar14 == 0)) || (puVar1 <= puVar19)) {
    if ((dec->incremental_ == 0 || puVar19 < puVar1) && (uVar14 != 0)) {
LAB_0010ae54:
      if ((dec->status_ == VP8_STATUS_SUSPENDED) || (iVar16 = 0, dec->status_ == VP8_STATUS_OK)) {
        dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
        iVar16 = 0;
      }
    }
    else {
      if (process_func != (ProcessRowsFunc)0x0) {
        if (iVar24 < last_row) {
          last_row = iVar24;
        }
        (*process_func)(dec,last_row);
      }
      dec->status_ = VP8_STATUS_OK;
      dec->last_pixel_ = (int)((ulong)((long)puVar19 - (long)data) >> 2);
      iVar16 = 1;
    }
  }
  else {
    dec->status_ = VP8_STATUS_SUSPENDED;
    iVar16 = (dec->saved_br_).eos_;
    (dec->br_).bit_pos_ = (dec->saved_br_).bit_pos_;
    (dec->br_).eos_ = iVar16;
    vVar9 = (dec->saved_br_).val_;
    puVar10 = (dec->saved_br_).buf_;
    sVar11 = (dec->saved_br_).pos_;
    (dec->br_).len_ = (dec->saved_br_).len_;
    (dec->br_).pos_ = sVar11;
    br->val_ = vVar9;
    (dec->br_).buf_ = puVar10;
    dec->last_pixel_ = dec->saved_last_pixel_;
    iVar16 = 1;
    if (0 < (dec->hdr_).color_cache_size_) {
      VP8LColorCacheCopy(&(dec->hdr_).saved_color_cache_,src);
    }
  }
  return iVar16;
}

Assistant:

static int DecodeImageData(VP8LDecoder* const dec, uint32_t* const data,
                           int width, int height, int last_row,
                           ProcessRowsFunc process_func) {
  int row = dec->last_pixel_ / width;
  int col = dec->last_pixel_ % width;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* src = data + dec->last_pixel_;
  uint32_t* last_cached = src;
  uint32_t* const src_end = data + width * height;     // End of data
  uint32_t* const src_last = data + width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int color_cache_limit = len_code_limit + hdr->color_cache_size_;
  int next_sync_row = dec->incremental_ ? row : 1 << 24;
  VP8LColorCache* const color_cache =
      (hdr->color_cache_size_ > 0) ? &hdr->color_cache_ : NULL;
  const int mask = hdr->huffman_mask_;
  const HTreeGroup* htree_group =
      (src < src_last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(dec->last_row_ < last_row);
  assert(src_last <= src_end);

  while (src < src_last) {
    int code;
    if (row >= next_sync_row) {
      SaveState(dec, (int)(src - data));
      next_sync_row = row + SYNC_EVERY_N_ROWS;
    }
    // Only update when changing tile. Note we could use this test:
    // if "((((prev_col ^ col) | prev_row ^ row)) > mask)" -> tile changed
    // but that's actually slower and needs storing the previous col/row.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    if (htree_group->is_trivial_code) {
      *src = htree_group->literal_arb;
      goto AdvanceByOne;
    }
    VP8LFillBitWindow(br);
    if (htree_group->use_packed_table) {
      code = ReadPackedSymbols(htree_group, br, src);
      if (VP8LIsEndOfStream(br)) break;
      if (code == PACKED_NON_LITERAL_CODE) goto AdvanceByOne;
    } else {
      code = ReadSymbol(htree_group->htrees[GREEN], br);
    }
    if (VP8LIsEndOfStream(br)) break;
    if (code < NUM_LITERAL_CODES) {  // Literal
      if (htree_group->is_trivial_literal) {
        *src = htree_group->literal_arb | (code << 8);
      } else {
        int red, blue, alpha;
        red = ReadSymbol(htree_group->htrees[RED], br);
        VP8LFillBitWindow(br);
        blue = ReadSymbol(htree_group->htrees[BLUE], br);
        alpha = ReadSymbol(htree_group->htrees[ALPHA], br);
        if (VP8LIsEndOfStream(br)) break;
        *src = ((uint32_t)alpha << 24) | (red << 16) | (code << 8) | blue;
      }
    AdvanceByOne:
      ++src;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
        if (color_cache != NULL) {
          while (last_cached < src) {
            VP8LColorCacheInsert(color_cache, *last_cached++);
          }
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);

      if (VP8LIsEndOfStream(br)) break;
      if (src - data < (ptrdiff_t)dist || src_end - src < (ptrdiff_t)length) {
        goto Error;
      } else {
        CopyBlock32b(src, dist, length);
      }
      src += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
      }
      // Because of the check done above (before 'src' was incremented by
      // 'length'), the following holds true.
      assert(src <= src_end);
      if (col & mask) htree_group = GetHtreeGroupForPos(hdr, col, row);
      if (color_cache != NULL) {
        while (last_cached < src) {
          VP8LColorCacheInsert(color_cache, *last_cached++);
        }
      }
    } else if (code < color_cache_limit) {  // Color cache
      const int key = code - len_code_limit;
      assert(color_cache != NULL);
      while (last_cached < src) {
        VP8LColorCacheInsert(color_cache, *last_cached++);
      }
      *src = VP8LColorCacheLookup(color_cache, key);
      goto AdvanceByOne;
    } else {  // Not reached
      goto Error;
    }
  }

  br->eos_ = VP8LIsEndOfStream(br);
  // In incremental decoding:
  // br->eos_ && src < src_last: if 'br' reached the end of the buffer and
  // 'src_last' has not been reached yet, there is not enough data. 'dec' has to
  // be reset until there is more data.
  // !br->eos_ && src < src_last: this cannot happen as either the buffer is
  // fully read, either enough has been read to reach 'src_last'.
  // src >= src_last: 'src_last' is reached, all is fine. 'src' can actually go
  // beyond 'src_last' in case the image is cropped and an LZ77 goes further.
  // The buffer might have been enough or there is some left. 'br->eos_' does
  // not matter.
  assert(!dec->incremental_ || (br->eos_ && src < src_last) || src >= src_last);
  if (dec->incremental_ && br->eos_ && src < src_last) {
    RestoreState(dec);
  } else if ((dec->incremental_ && src >= src_last) || !br->eos_) {
    // Process the remaining rows corresponding to last row-block.
    if (process_func != NULL) {
      process_func(dec, row > last_row ? last_row : row);
    }
    dec->status_ = VP8_STATUS_OK;
    dec->last_pixel_ = (int)(src - data);  // end-of-scan marker
  } else {
    // if not incremental, and we are past the end of buffer (eos_=1), then this
    // is a real bitstream error.
    goto Error;
  }
  return 1;

 Error:
  return VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
}